

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AESKey.cpp
# Opt level: O2

ByteString * __thiscall AESKey::getKeyCheckValue(ByteString *__return_storage_ptr__,AESKey *this)

{
  char cVar1;
  int iVar2;
  CryptoFactory *pCVar3;
  undefined4 extraout_var;
  size_t sVar5;
  uchar *__s;
  ByteString data;
  ByteString encryptedFinal;
  ByteString local_78;
  ByteString iv;
  long *plVar4;
  
  ByteString::ByteString(&iv);
  ByteString::ByteString(&data);
  ByteString::ByteString(__return_storage_ptr__);
  ByteString::ByteString(&encryptedFinal);
  pCVar3 = CryptoFactory::i();
  iVar2 = (**pCVar3->_vptr_CryptoFactory)(pCVar3,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar4 == (long *)0x0) goto LAB_0014b1df;
  sVar5 = (**(code **)(*plVar4 + 0x68))(plVar4);
  ByteString::resize(&data,sVar5);
  __s = ByteString::operator[](&data,0);
  sVar5 = ByteString::size(&data);
  memset(__s,0,sVar5);
  ByteString::ByteString(&local_78);
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,this,4,&iv,0,0,&local_78,0);
  if (cVar1 == '\0') {
LAB_0014b1c4:
    ByteString::~ByteString(&local_78);
  }
  else {
    cVar1 = (**(code **)(*plVar4 + 0x18))(plVar4,&data,__return_storage_ptr__);
    if (cVar1 == '\0') goto LAB_0014b1c4;
    cVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,&encryptedFinal);
    ByteString::~ByteString(&local_78);
    if (cVar1 != '\0') {
      pCVar3 = CryptoFactory::i();
      (*pCVar3->_vptr_CryptoFactory[1])(pCVar3,plVar4);
      ByteString::operator+=(__return_storage_ptr__,&encryptedFinal);
      ByteString::resize(__return_storage_ptr__,3);
      goto LAB_0014b1df;
    }
  }
  pCVar3 = CryptoFactory::i();
  (*pCVar3->_vptr_CryptoFactory[1])(pCVar3,plVar4);
LAB_0014b1df:
  ByteString::~ByteString(&encryptedFinal);
  ByteString::~ByteString(&data);
  ByteString::~ByteString(&iv);
  return __return_storage_ptr__;
}

Assistant:

ByteString AESKey::getKeyCheckValue() const
{
	ByteString iv;
	ByteString data;
	ByteString encryptedData;
	ByteString encryptedFinal;

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::AES);
	if (cipher == NULL) return encryptedData;

	// Single block of null (0x00) bytes
	data.resize(cipher->getBlockSize());
	memset(&data[0], 0, data.size());

	if (!cipher->encryptInit(this, SymMode::ECB, iv, false) ||
	    !cipher->encryptUpdate(data, encryptedData) ||
	    !cipher->encryptFinal(encryptedFinal))
	{
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return encryptedData;
	}
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);

	encryptedData += encryptedFinal;
	encryptedData.resize(3);

	return encryptedData;
}